

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::tls1_choose_signature_algorithm(SSL_HANDSHAKE *hs,SSL_CREDENTIAL *cred,uint16_t *out)

{
  unsigned_short *puVar1;
  SSL *ssl;
  bool bVar2;
  uint16_t uVar3;
  size_t sVar4;
  unsigned_short *puVar5;
  int reason;
  size_t sVar6;
  unsigned_short *puVar7;
  int line;
  long lVar8;
  uint16_t sigalg;
  uint16_t *local_40;
  uint16_t *local_38;
  
  ssl = hs->ssl;
  bVar2 = ssl_credential_st::UsesPrivateKey(cred);
  if (bVar2) {
    uVar3 = ssl_protocol_version(ssl);
    if (uVar3 < 0x303) {
      bVar2 = tls1_get_legacy_signature_algorithm
                        (out,(cred->pubkey)._M_t.
                             super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
      if (bVar2) {
        return true;
      }
      reason = 0xfd;
      line = 0x11ae;
    }
    else {
      if (cred->type == kDelegated) {
        sVar4 = (hs->peer_delegated_credential_sigalgs).size_;
        local_40 = (hs->peer_delegated_credential_sigalgs).data_;
      }
      else {
        sVar6 = (hs->peer_sigalgs).size_;
        sVar4 = 2;
        if (uVar3 != 0x303 || sVar6 != 0) {
          sVar4 = sVar6;
        }
        local_40 = tls1_choose_signature_algorithm::kTLS12Default;
        if (uVar3 != 0x303 || sVar6 != 0) {
          local_40 = (hs->peer_sigalgs).data_;
        }
      }
      sVar6 = (cred->sigalgs).size_;
      if (sVar6 == 0) {
        puVar7 = &kSignSignatureAlgorithms;
        sVar6 = 0xc;
      }
      else {
        puVar7 = (cred->sigalgs).data_;
      }
      puVar1 = local_40 + sVar4;
      local_38 = out;
      for (lVar8 = 0; sVar6 * 2 != lVar8; lVar8 = lVar8 + 2) {
        sigalg = *(uint16_t *)((long)puVar7 + lVar8);
        bVar2 = ssl_pkey_supports_algorithm
                          (ssl,(cred->pubkey)._M_t.
                               super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,sigalg,false
                          );
        if ((bVar2) &&
           (puVar5 = std::
                     __find_if<unsigned_short_const*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_short_const>>
                               (local_40,puVar1,&sigalg), puVar5 != puVar1)) {
          *local_38 = sigalg;
          return true;
        }
      }
      reason = 0xfd;
      line = 0x11d2;
    }
  }
  else {
    reason = 0xe4;
    line = 0x11a5;
  }
  ERR_put_error(0x10,0,reason,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                ,line);
  return false;
}

Assistant:

bool tls1_choose_signature_algorithm(SSL_HANDSHAKE *hs,
                                     const SSL_CREDENTIAL *cred,
                                     uint16_t *out) {
  SSL *const ssl = hs->ssl;
  if (!cred->UsesPrivateKey()) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNKNOWN_CERTIFICATE_TYPE);
    return false;
  }

  // Before TLS 1.2, the signature algorithm isn't negotiated as part of the
  // handshake.
  uint16_t version = ssl_protocol_version(ssl);
  if (version < TLS1_2_VERSION) {
    if (!tls1_get_legacy_signature_algorithm(out, cred->pubkey.get())) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_NO_COMMON_SIGNATURE_ALGORITHMS);
      return false;
    }
    return true;
  }

  Span<const uint16_t> peer_sigalgs;
  if (cred->type == SSLCredentialType::kDelegated) {
    peer_sigalgs = hs->peer_delegated_credential_sigalgs;
  } else {
    peer_sigalgs = hs->peer_sigalgs;
    if (peer_sigalgs.empty() && version == TLS1_2_VERSION) {
      // If the client didn't specify any signature_algorithms extension, it is
      // interpreted as SHA-1. See
      // http://tools.ietf.org/html/rfc5246#section-7.4.1.4.1
      static const uint16_t kTLS12Default[] = {SSL_SIGN_RSA_PKCS1_SHA1,
                                               SSL_SIGN_ECDSA_SHA1};
      peer_sigalgs = kTLS12Default;
    }
  }

  Span<const uint16_t> sigalgs =
      cred->sigalgs.empty() ? Span(kSignSignatureAlgorithms) : cred->sigalgs;
  for (uint16_t sigalg : sigalgs) {
    if (!ssl_pkey_supports_algorithm(ssl, cred->pubkey.get(), sigalg,
                                     /*is_verify=*/false)) {
      continue;
    }

    if (std::find(peer_sigalgs.begin(), peer_sigalgs.end(), sigalg) !=
        peer_sigalgs.end()) {
      *out = sigalg;
      return true;
    }
  }

  OPENSSL_PUT_ERROR(SSL, SSL_R_NO_COMMON_SIGNATURE_ALGORITHMS);
  return false;
}